

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::IfExpr::IfExpr(IfExpr *this,Location *loc)

{
  Location *loc_local;
  IfExpr *this_local;
  
  ExprMixin<(wabt::ExprType)19>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)19>,loc);
  (this->super_ExprMixin<(wabt::ExprType)19>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__IfExpr_01e54128;
  Block::Block(&this->true_);
  intrusive_list<wabt::Expr>::intrusive_list(&this->false_);
  Location::Location(&this->false_end_loc);
  return;
}

Assistant:

explicit IfExpr(const Location& loc = Location())
      : ExprMixin<ExprType::If>(loc) {}